

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O3

void ws_ping(intptr_t fd,fio_protocol_s *ws)

{
  fio_write_args_s *pfVar1;
  uintptr_t uVar2;
  fio_write_args_s local_50;
  fio_write_args_s local_28;
  
  if (*(char *)((long)&ws[3].ping + 1) == '\0') {
    pfVar1 = &local_50;
    local_50.data.buffer = anon_var_dwarf_68916;
    uVar2 = 2;
  }
  else {
    pfVar1 = &local_28;
    local_28.data.buffer = anon_var_dwarf_68934;
    uVar2 = 6;
  }
  (pfVar1->after).dealloc = FIO_DEALLOC_NOOP;
  pfVar1->length = uVar2;
  pfVar1->offset = 0;
  pfVar1->field_0x20 = 0;
  fio_write2_fn(fd,*pfVar1);
  return;
}

Assistant:

static void ws_ping(intptr_t fd, fio_protocol_s *ws) {
  (void)(ws);
  if (((ws_s *)ws)->is_client) {
    fio_write2(fd, .data.buffer = "\x89\x80MASK", .length = 6,
               .after.dealloc = FIO_DEALLOC_NOOP);
  } else {
    fio_write2(fd, .data.buffer = "\x89\x00", .length = 2,
               .after.dealloc = FIO_DEALLOC_NOOP);
  }
}